

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTable.h
# Opt level: O1

void __thiscall SGParser::ParseTable::~ParseTable(ParseTable *this)

{
  pointer pRVar1;
  pointer ppuVar2;
  pointer pSVar3;
  pointer pTVar4;
  pointer pNVar5;
  
  Destroy(this);
  pRVar1 = (this->ReduceProductions).
           super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1,(long)(this->ReduceProductions).
                                 super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar1);
  }
  ppuVar2 = (this->GotoTable).
            super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppuVar2 != (pointer)0x0) {
    operator_delete(ppuVar2,(long)(this->GotoTable).
                                  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppuVar2
                   );
  }
  ppuVar2 = (this->ActionTable).
            super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppuVar2 != (pointer)0x0) {
    operator_delete(ppuVar2,(long)(this->ActionTable).
                                  super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppuVar2
                   );
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->ProductionErrorTerminals)._M_h);
  pSVar3 = (this->StateInfos).
           super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->StateInfos).
                                 super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  pTVar4 = (this->Terminals).
           super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar4 != (pointer)0x0) {
    operator_delete(pTVar4,(long)(this->Terminals).
                                 super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar4);
  }
  pNVar5 = (this->NonTerminals).
           super__Vector_base<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar5 != (pointer)0x0) {
    operator_delete(pNVar5,(long)(this->NonTerminals).
                                 super__Vector_base<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pNVar5);
    return;
  }
  return;
}

Assistant:

~ParseTable() { Destroy(); }